

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::move_storage(torrent *this,string *save_path,move_flags_t flags)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  string *in_RCX;
  string_view f;
  string path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  size_type local_a0;
  undefined1 local_98 [16];
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  _Function_base local_70;
  _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
  local_50;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_02,iVar2) + 0x68) & 8) != 0) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&path);
        in_RCX = &this->m_save_path;
        alert_manager::
        emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                  ((alert_manager *)CONCAT44(extraout_var_03,iVar2),(torrent_handle *)&path,
                   save_path,in_RCX);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&path._M_string_length);
      }
      f._M_str = (char *)in_RCX;
      f._M_len = (size_t)(save_path->_M_dataplus)._M_p;
      complete_abi_cxx11_(&path,(libtorrent *)save_path->_M_string_length,f);
      ::std::__cxx11::string::operator=((string *)&this->m_save_path,(string *)&path);
    }
    else {
      if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var_04,iVar2) + 0x68) & 8) != 0) {
          iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          get_handle((torrent *)&path);
          alert_manager::
          emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                    ((alert_manager *)CONCAT44(extraout_var_05,iVar2),(torrent_handle *)&path,
                     save_path,&this->m_save_path);
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&path._M_string_length);
        }
        ::std::__cxx11::string::_M_assign((string *)&this->m_save_path);
        set_need_save_resume(this,(resume_data_flags_t)0x20);
        return;
      }
      ::std::__cxx11::string::string((string *)&path,(string *)save_path);
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      local_a0 = path._M_string_length;
      uVar1 = (this->m_storage).m_idx.m_val;
      local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p == &path.field_2) {
        local_98._8_8_ = path.field_2._8_8_;
      }
      else {
        local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path._M_dataplus._M_p;
      }
      path._M_string_length = 0;
      path.field_2._M_local_buf[0] = '\0';
      path._M_dataplus._M_p = (pointer)&path.field_2;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      local_50._M_f = (offset_in_torrent_to_subr)on_storage_moved;
      local_50._8_8_ = 0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_80[0]._M_pi;
      local_88 = (element_type *)0x0;
      a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::
      function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>
      ::
      function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>,void>
                ((function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>
                  *)&local_70,&local_50);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                ((long *)CONCAT44(extraout_var,iVar2),uVar1,&local_a8,flags,&local_70);
      ::std::_Function_base::~_Function_base(&local_70);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
                  .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::torrent>,_false>.
                  _M_head_impl.
                  super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
      ::std::__cxx11::string::~string((string *)&local_a8);
      this->field_0x600 = this->field_0x600 | 0x20;
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    ::std::__cxx11::string::~string((string *)&path);
  }
  else {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x68) & 8) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&path);
      local_50._M_f = CONCAT44(local_50._M_f._4_4_,0x7d);
      local_88 = (element_type *)((ulong)local_88 & 0xffffffffffffff00);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::asio::error::basic_errors,char_const(&)[1],libtorrent::operation_t>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar2),(torrent_handle *)&path,
                 (basic_errors *)&local_50,(char (*) [1])0x3829db,(operation_t *)&local_88);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&path._M_string_length);
    }
  }
  return;
}

Assistant:

void torrent::move_storage(std::string const& save_path, move_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle()
					, boost::asio::error::operation_aborted
					, "", operation_t::unknown);
			return;
		}

		// if we don't have metadata yet, we don't know anything about the file
		// structure and we have to assume we don't have any file.
		if (!valid_metadata())
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string const& path = save_path;
#endif
			m_save_path = complete(path);
			return;
		}

		// storage may be nullptr during shutdown
		if (m_storage)
		{
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string path = save_path;
#endif
			m_ses.disk_thread().async_move_storage(m_storage, std::move(path), flags
				, std::bind(&torrent::on_storage_moved, shared_from_this(), _1, _2, _3));
			m_moving_storage = true;
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);

#if TORRENT_USE_UNC_PATHS
			m_save_path = canonicalize_path(save_path);
#else

			m_save_path = save_path;
#endif
			set_need_save_resume(torrent_handle::if_config_changed);
		}
	}